

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  spv_result_t sVar2;
  spv_result_t error_12;
  spv_result_t error_11;
  spv_result_t error_10;
  spv_result_t error_9;
  spv_result_t error_8;
  spv_result_t error_7;
  spv_result_t error_6;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpVariable) {
LAB_0021e532:
    sVar2 = anon_unknown_2::ValidateVariable(_,inst);
    goto joined_r0x0021e6bc;
  }
  if (OVar1 == OpImageTexelPointer) {
    return SPV_SUCCESS;
  }
  if (OVar1 == OpLoad) {
    sVar2 = anon_unknown_2::ValidateLoad(_,inst);
    goto joined_r0x0021e6bc;
  }
  if (OVar1 == OpStore) {
    sVar2 = anon_unknown_2::ValidateStore(_,inst);
    goto joined_r0x0021e6bc;
  }
  if (OVar1 - OpCopyMemory < 2) {
    sVar2 = anon_unknown_2::ValidateCopyMemory(_,inst);
    goto joined_r0x0021e6bc;
  }
  if (1 < OVar1 - OpAccessChain) {
    if (OVar1 == OpPtrAccessChain) {
LAB_0021e5ca:
      sVar2 = anon_unknown_2::ValidatePtrAccessChain(_,inst);
      goto joined_r0x0021e6bc;
    }
    if (OVar1 == OpArrayLength) {
LAB_0021e63c:
      sVar2 = anon_unknown_2::ValidateArrayLength(_,inst);
      goto joined_r0x0021e6bc;
    }
    if (OVar1 == OpGenericPtrMemSemantics) {
      return SPV_SUCCESS;
    }
    if (OVar1 != OpInBoundsPtrAccessChain) {
      if (OVar1 - OpPtrEqual < 3) {
        sVar2 = anon_unknown_2::ValidatePtrComparison(_,inst);
        goto joined_r0x0021e6bc;
      }
      if (OVar1 == OpUntypedVariableKHR) goto LAB_0021e532;
      if (1 < OVar1 - OpUntypedAccessChainKHR) {
        if (OVar1 - OpUntypedPtrAccessChainKHR < 2) goto LAB_0021e5ca;
        if (OVar1 != OpUntypedArrayLengthKHR) {
          if (OVar1 - OpCooperativeMatrixLoadKHR < 2) {
            sVar2 = anon_unknown_2::ValidateCooperativeMatrixLoadStoreKHR(_,inst);
            goto joined_r0x0021e6bc;
          }
          if (OVar1 != OpCooperativeMatrixLengthKHR) {
            if (OVar1 - OpCooperativeMatrixLoadNV < 2) {
              sVar2 = anon_unknown_2::ValidateCooperativeMatrixLoadStoreNV(_,inst);
              goto joined_r0x0021e6bc;
            }
            if (OVar1 != OpCooperativeMatrixLengthNV) {
              if (OVar1 - OpCooperativeMatrixLoadTensorNV < 2) {
                sVar2 = anon_unknown_2::ValidateCooperativeMatrixLoadStoreTensorNV(_,inst);
              }
              else {
                if (OVar1 != OpRawAccessChainNV) {
                  return SPV_SUCCESS;
                }
                sVar2 = anon_unknown_2::ValidateRawAccessChain(_,inst);
              }
              goto joined_r0x0021e6bc;
            }
          }
          sVar2 = anon_unknown_2::ValidateCooperativeMatrixLengthNV(_,inst);
          goto joined_r0x0021e6bc;
        }
        goto LAB_0021e63c;
      }
    }
  }
  sVar2 = anon_unknown_2::ValidateAccessChain(_,inst);
joined_r0x0021e6bc:
  if (sVar2 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar2;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreTensorNV(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}